

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoopLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  void *pvVar4;
  long lVar5;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  bool bVar7;
  int iVar8;
  LogMessage *other;
  long *plVar9;
  undefined1 *puVar10;
  iterator iVar11;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var12;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  long *plVar16;
  ulong *puVar17;
  size_type *psVar18;
  Result *_result;
  int iVar19;
  undefined1 *nn;
  _Alloc_hider _Var20;
  RepeatedField<long> *this_01;
  undefined1 *puVar21;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  condition_set;
  string err_4;
  string conditionVar;
  NeuralNetworkSpecValidator bodyNNValidator;
  NeuralNetworkSpecValidator conditionNNValidator;
  undefined1 local_2b8 [40];
  _Base_ptr local_290;
  string local_288;
  NeuralNetworkSpecValidator *local_268;
  key_type local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [40];
  _Base_ptr local_1f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_128;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_b8;
  NeuralNetwork *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  LogMessage local_68;
  
  validateInputCount(__return_storage_ptr__,layer,0,1);
  bVar7 = Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_160 + 0x10);
  local_160._8_8_ = 0;
  local_160._16_8_ = local_160._16_8_ & 0xffffffffffffff00;
  local_160._0_8_ = paVar2;
  Result::Result(__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._0_8_ != paVar2) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  bVar7 = Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  local_268 = this;
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ != 0) {
    if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_160,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    pvVar4 = ((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0];
    if ((*(int *)((long)pvVar4 + 0x10) != 0) &&
       (this_01 = (RepeatedField<long> *)((long)pvVar4 + 0x10), 0 < this_01->current_size_)) {
      iVar19 = 0;
      do {
        plVar9 = google::protobuf::RepeatedField<long>::Get(this_01,iVar19);
        if (1 < *plVar9) {
          plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          lVar5 = *plVar9;
          local_2b8._0_8_ = local_2b8 + 0x10;
          std::__cxx11::string::_M_construct<char*>((string *)local_2b8,lVar5,plVar9[1] + lVar5);
          plVar9 = (long *)std::__cxx11::string::replace((ulong)local_2b8,0,(char *)0x0,0x3e3f68);
          plVar16 = plVar9 + 2;
          if ((long *)*plVar9 == plVar16) {
            local_220._16_8_ = *plVar16;
            local_220._24_8_ = plVar9[3];
            local_220._0_8_ = local_220 + 0x10;
          }
          else {
            local_220._16_8_ = *plVar16;
            local_220._0_8_ = (long *)*plVar9;
          }
          local_220._8_8_ = plVar9[1];
          *plVar9 = (long)plVar16;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append(local_220);
          puVar17 = (ulong *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_160._16_8_ = *puVar17;
            local_160._24_8_ = plVar9[3];
            local_160._0_8_ = paVar2;
          }
          else {
            local_160._16_8_ = *puVar17;
            local_160._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar9;
          }
          local_160._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
            operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
          }
          if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
            operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_160);
          local_260.field_2._M_allocated_capacity = local_160._16_8_;
          _Var20._M_p = (pointer)local_160._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._0_8_ == paVar2) {
            return __return_storage_ptr__;
          }
          goto LAB_0036c939;
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 < this_01->current_size_);
    }
  }
  if (layer->_oneof_case_[0] == 0x267) {
    puVar21 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar21 = Specification::_LoopLayerParams_default_instance_;
  }
  nn = (undefined1 *)((InnerProductLayerParams *)puVar21)->bias_;
  if ((NeuralNetwork *)nn == (NeuralNetwork *)0x0) {
    nn = Specification::_NeuralNetwork_default_instance_;
  }
  plVar9 = (long *)((ulong)(((ActivationParams *)puVar21)->NonlinearityType_).linear_ &
                   0xfffffffffffffffe);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  lVar5 = *plVar9;
  std::__cxx11::string::_M_construct<char*>((string *)&local_260,lVar5,plVar9[1] + lVar5);
  puVar10 = (undefined1 *)((BatchnormLayerParams *)puVar21)->mean_;
  if ((NeuralNetwork *)puVar10 == (NeuralNetwork *)0x0) {
    puVar10 = Specification::_NeuralNetwork_default_instance_;
  }
  if ((((NeuralNetwork *)puVar10)->layers_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    lVar5 = *plVar9;
    local_2b8._0_8_ = local_2b8 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_2b8,lVar5,plVar9[1] + lVar5);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)local_2b8,0,(char *)0x0,0x3e3f68);
    plVar16 = plVar9 + 2;
    if ((long *)*plVar9 == plVar16) {
      local_220._16_8_ = *plVar16;
      local_220._24_8_ = plVar9[3];
      local_220._0_8_ = local_220 + 0x10;
    }
    else {
      local_220._16_8_ = *plVar16;
      local_220._0_8_ = (long *)*plVar9;
    }
    local_220._8_8_ = plVar9[1];
    *plVar9 = (long)plVar16;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_220);
    puVar17 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_160._16_8_ = *puVar17;
      local_160._24_8_ = plVar9[3];
      local_160._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_160 + 0x10);
    }
    else {
      local_160._16_8_ = *puVar17;
      local_160._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_160._8_8_ = plVar9[1];
    *plVar9 = (long)puVar17;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
      operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
    }
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_160);
  }
  else {
    iVar19 = (((NeuralNetwork *)nn)->layers_).super_RepeatedPtrFieldBase.current_size_;
    local_b0 = (NeuralNetwork *)puVar10;
    iVar8 = std::__cxx11::string::compare((char *)&local_260);
    if (((iVar19 < 1) || (iVar8 != 0)) &&
       ((iVar8 = std::__cxx11::string::compare((char *)&local_260), 0 < iVar19 || (iVar8 == 0)))) {
      if (((0 < iVar19) || (((InnerProductLayerParams *)puVar21)->outputchannels_ != 0)) ||
         ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != 0)) {
        this_00 = &local_268->blobs;
        local_b8 = &local_268->ModelIOBlobNameToRank;
        local_c0 = &local_268->blobNameToRank;
        NeuralNetworkSpecValidator
                  ((NeuralNetworkSpecValidator *)local_160,this_00,local_b8,
                   local_268->ndArrayInterpretation,local_268->loopStackDepth,local_c0);
        if (iVar19 < 1) {
LAB_0036ceda:
          NeuralNetworkSpecValidator
                    ((NeuralNetworkSpecValidator *)local_220,this_00,local_b8,
                     local_268->ndArrayInterpretation,local_268->loopStackDepth + 1,local_c0);
          validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
                    (__return_storage_ptr__,(NeuralNetworkSpecValidator *)local_220,local_b0);
          bVar7 = Result::good(__return_storage_ptr__);
          if (bVar7) {
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            if (iVar19 < 1) {
              if ((_Rb_tree_header *)local_1b8._M_impl.super__Rb_tree_header._M_header._M_left !=
                  &local_1b8._M_impl.super__Rb_tree_header) {
                p_Var15 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
                do {
                  local_2b8._0_8_ = local_2b8 + 0x10;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_2b8,*(long *)(p_Var15 + 1),
                             (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
                  p_Var13 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               ::operator[](this_00,(key_type *)local_2b8);
                  pmVar14 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                          *)&local_1b8,(key_type *)local_2b8);
                  _Var6._M_node = (pmVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  pmVar14 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                          *)&local_1b8,(key_type *)local_2b8);
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                            (p_Var13,_Var6,
                             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )&(pmVar14->_M_t)._M_impl.super__Rb_tree_header);
                  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
                    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
                  }
                  p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
                } while ((_Rb_tree_header *)p_Var15 != &local_1b8._M_impl.super__Rb_tree_header);
              }
            }
            else if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left !=
                     &local_f8._M_impl.super__Rb_tree_header) {
              p_Var15 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
              do {
                local_2b8._0_8_ = local_2b8 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_2b8,*(long *)(p_Var15 + 1),
                           (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
                iVar11 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::find(&local_1b8,(key_type *)local_2b8);
                if ((_Rb_tree_header *)iVar11._M_node != &local_1b8._M_impl.super__Rb_tree_header) {
                  p_Var13 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               ::operator[](this_00,(key_type *)local_2b8);
                  pmVar14 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                          *)&local_1b8,(key_type *)local_2b8);
                  _Var6._M_node = (pmVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  pmVar14 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                          *)&local_1b8,(key_type *)local_2b8);
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                            (p_Var13,_Var6,
                             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )&(pmVar14->_M_t)._M_impl.super__Rb_tree_header);
                }
                if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
                  operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
                }
                p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
              } while ((_Rb_tree_header *)p_Var15 != &local_f8._M_impl.super__Rb_tree_header);
            }
            Result::Result(__return_storage_ptr__);
          }
          ~NeuralNetworkSpecValidator((NeuralNetworkSpecValidator *)local_220);
        }
        else {
          validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
                    (__return_storage_ptr__,(NeuralNetworkSpecValidator *)local_160,
                     (NeuralNetwork *)nn);
          bVar7 = Result::good(__return_storage_ptr__);
          if (bVar7) {
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::find(&this_00->_M_t,&local_260);
            if ((_Rb_tree_header *)iVar11._M_node ==
                &(local_268->blobs)._M_t._M_impl.super__Rb_tree_header) {
              iVar11 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ::find(&local_f8,&local_260);
              if ((_Rb_tree_header *)iVar11._M_node == &local_f8._M_impl.super__Rb_tree_header) {
                plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
                lVar5 = *plVar9;
                local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_240,lVar5,plVar9[1] + lVar5);
                std::operator+(&local_180,"Loop Layer \'",&local_240);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
                psVar18 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_288.field_2._M_allocated_capacity = *psVar18;
                  local_288.field_2._8_8_ = plVar9[3];
                  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                }
                else {
                  local_288.field_2._M_allocated_capacity = *psVar18;
                  local_288._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_288._M_string_length = plVar9[1];
                *plVar9 = (long)psVar18;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2b8,&local_288,&local_260);
                plVar9 = (long *)std::__cxx11::string::append(local_2b8);
                plVar16 = plVar9 + 2;
                if ((long *)*plVar9 == plVar16) {
                  local_220._16_8_ = *plVar16;
                  local_220._24_8_ = plVar9[3];
                  local_220._0_8_ = local_220 + 0x10;
                }
                else {
                  local_220._16_8_ = *plVar16;
                  local_220._0_8_ = (long *)*plVar9;
                }
                local_220._8_8_ = plVar9[1];
                *plVar9 = (long)plVar16;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
                  operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  local_288.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_dataplus._M_p != &local_180.field_2) {
                  operator_delete(local_180._M_dataplus._M_p,
                                  local_180.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_240._M_dataplus._M_p != &local_240.field_2) {
                  operator_delete(local_240._M_dataplus._M_p,
                                  local_240.field_2._M_allocated_capacity + 1);
                }
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_220);
                if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
                  operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
                }
                goto LAB_0036d0ef;
              }
            }
            else {
              p_Var12 = &std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::operator[](this_00,&local_260)->_M_t;
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_220,p_Var12);
              p_Var12 = &std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                       *)&local_f8,&local_260)->_M_t;
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2b8,p_Var12);
              if (local_1f8 == local_290) {
                bVar7 = std::__equal<false>::
                        equal<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                                  ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_220._24_8_,(_Base_ptr)(local_220 + 8),
                                   (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_2b8._24_8_);
              }
              else {
                bVar7 = false;
              }
              if (bVar7 == false) {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2b8);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_220);
              }
              else {
                plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
                lVar5 = *plVar9;
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_a8,lVar5,plVar9[1] + lVar5);
                std::operator+(&local_88,"Loop Layer \'",&local_a8);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_88);
                psVar18 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_240.field_2._M_allocated_capacity = *psVar18;
                  local_240.field_2._8_8_ = plVar9[3];
                  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
                }
                else {
                  local_240.field_2._M_allocated_capacity = *psVar18;
                  local_240._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_240._M_string_length = plVar9[1];
                *plVar9 = (long)psVar18;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::operator+(&local_180,&local_240,&local_260);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
                psVar18 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_288.field_2._M_allocated_capacity = *psVar18;
                  local_288.field_2._8_8_ = plVar9[3];
                  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                }
                else {
                  local_288.field_2._M_allocated_capacity = *psVar18;
                  local_288._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_288._M_string_length = plVar9[1];
                *plVar9 = (long)psVar18;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_dataplus._M_p != &local_180.field_2) {
                  operator_delete(local_180._M_dataplus._M_p,
                                  local_180.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_240._M_dataplus._M_p != &local_240.field_2) {
                  operator_delete(local_240._M_dataplus._M_p,
                                  local_240.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  local_a8.field_2._M_allocated_capacity + 1);
                }
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_288);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  local_288.field_2._M_allocated_capacity + 1);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2b8);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_220);
                if (bVar7 != false) goto LAB_0036d0ef;
              }
            }
            if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left !=
                &local_f8._M_impl.super__Rb_tree_header) {
              p_Var15 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
              do {
                local_220._0_8_ = local_220 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_220,*(long *)(p_Var15 + 1),
                           (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
                p_Var13 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             ::operator[](this_00,(key_type *)local_220);
                pmVar14 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                        *)&local_f8,(key_type *)local_220);
                _Var6._M_node = (pmVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                pmVar14 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                        *)&local_f8,(key_type *)local_220);
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                          (p_Var13,_Var6,
                           (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )&(pmVar14->_M_t)._M_impl.super__Rb_tree_header);
                if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
                  operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
                }
                p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
              } while ((_Rb_tree_header *)p_Var15 != &local_f8._M_impl.super__Rb_tree_header);
            }
            goto LAB_0036ceda;
          }
        }
LAB_0036d0ef:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&local_f8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree(&local_128);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)(local_160 + 8));
        goto LAB_0036c925;
      }
      plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      lVar5 = *plVar9;
      local_2b8._0_8_ = local_2b8 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_2b8,lVar5,plVar9[1] + lVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                     "Loop Layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      plVar9 = (long *)std::__cxx11::string::append(local_220);
      puVar17 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_160._16_8_ = *puVar17;
        local_160._24_8_ = plVar9[3];
        local_160._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_160 + 0x10);
      }
      else {
        local_160._16_8_ = *puVar17;
        local_160._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar9;
      }
      local_160._8_8_ = plVar9[1];
      *plVar9 = (long)puVar17;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
        operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
      }
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_160);
    }
    else {
      plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      lVar5 = *plVar9;
      local_2b8._0_8_ = local_2b8 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_2b8,lVar5,plVar9[1] + lVar5);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)local_2b8,0,(char *)0x0,0x3e3f68);
      plVar16 = plVar9 + 2;
      if ((long *)*plVar9 == plVar16) {
        local_220._16_8_ = *plVar16;
        local_220._24_8_ = plVar9[3];
        local_220._0_8_ = local_220 + 0x10;
      }
      else {
        local_220._16_8_ = *plVar16;
        local_220._0_8_ = (long *)*plVar9;
      }
      local_220._8_8_ = plVar9[1];
      *plVar9 = (long)plVar16;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append(local_220);
      puVar17 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_160._16_8_ = *puVar17;
        local_160._24_8_ = plVar9[3];
        local_160._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_160 + 0x10);
      }
      else {
        local_160._16_8_ = *puVar17;
        local_160._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar9;
      }
      local_160._8_8_ = plVar9[1];
      *plVar9 = (long)puVar17;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
        operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
      }
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_160);
    }
  }
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
LAB_0036c925:
  _Var20._M_p = local_260._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
LAB_0036c939:
    operator_delete(_Var20._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoopLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 0, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 0, 0));

    // check that if input exists, and if its shape exists, its scalar
    if (layer.inputtensor_size()) {
        auto &in_tensor = layer.inputtensor(0);
        if (in_tensor.dimvalue_size()) {
            for (int i=0; i < in_tensor.dimvalue_size(); i++) {
                if (in_tensor.dimvalue(i) > 1) {
                    std::string err = "Loop Layer '" + std::string(layer.name()) + "' input's length cannot be more than 1";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    const auto& params = layer.loop();
    const auto &conditionNNSpec = params.conditionnetwork();
    std::string conditionVar = params.conditionvar();
    const auto &bodyNNSpec = params.bodynetwork();
    bool isConditionNet = (conditionNNSpec.layers_size() > 0) ? true : false;

    // validate some generic requirements for the existense of fields
    if (bodyNNSpec.layers_size() == 0) {
        std::string err = "Loop Layer '" + std::string(layer.name()) + "' has an empty body network";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if ((conditionVar == "" && isConditionNet) || (conditionVar != "" && !isConditionNet)) {
        std::string err = "Loop Layer '" + std::string(layer.name()) + "': condition variable must be provided if condition network exists and vice versa.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (!isConditionNet && params.maxloopiterations() == 0 && layer.input_size() == 0) {
        std::string err = "Loop Layer '" + std::string(layer.name()) + "': has no input, no condition network and max loop iterations is 0.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }


    NeuralNetworkSpecValidator conditionNNValidator(blobs, ModelIOBlobNameToRank, ndArrayInterpretation, loopStackDepth, blobNameToRank);

    // validate the condition network if it exists
    if (isConditionNet) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(conditionNNValidator.validateNeuralNetwork(conditionNNSpec));

        // conditionVar must be produced by the condition network
        if (blobs.find(conditionVar) == blobs.end()) { // conditionVar not in the parent NN
            if (conditionNNValidator.blobs.find(conditionVar) == conditionNNValidator.blobs.end()) {
                std::string err = "Loop Layer '" + std::string(layer.name()) + "': has conditionVar named '" + conditionVar + "' which is not produced by the condition network";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        } else { // conditionVar in the parent NN: must be regenerated by the condition network
            std::set<std::string> parent_set = blobs[conditionVar];
            std::set<std::string> condition_set = conditionNNValidator.blobs[conditionVar];
            if (parent_set == condition_set) {
                std::string err = "Loop Layer '" + std::string(layer.name()) + "': has conditionVar named '" + conditionVar + "' which is not produced by the condition network";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }

        // add the blobs generated by the condition network to the scope of the parent network
        for (auto& blob_map: conditionNNValidator.blobs) {
            std::string current_blob_name = blob_map.first;
            blobs[current_blob_name].insert(conditionNNValidator.blobs[current_blob_name].begin(),
                                            conditionNNValidator.blobs[current_blob_name].end());
        }
    }

    // validate the body network
    NeuralNetworkSpecValidator bodyNNValidator(blobs, ModelIOBlobNameToRank, ndArrayInterpretation, loopStackDepth + 1, blobNameToRank);
    HANDLE_RESULT_AND_RETURN_ON_ERROR(bodyNNValidator.validateNeuralNetwork(bodyNNSpec));

    // update the set of "blobs" of the current Neural Network:
    // - if there is no condition network, all the blobs generated in the body network gets added to the scope of the parent network
    // - if there is a condition network, all its blobs gets added to the overall scope (already done above), as well the ones from the bodynetwork that are present in the condition net.

    if (!isConditionNet) {
        for (auto& blob_map: bodyNNValidator.blobs) {
            std::string current_blob_name = blob_map.first;
            blobs[current_blob_name].insert(bodyNNValidator.blobs[current_blob_name].begin(),
                                            bodyNNValidator.blobs[current_blob_name].end());
        }
    } else {
        for (auto& blob_map: conditionNNValidator.blobs) {
            std::string current_blob_name = blob_map.first;
            if (bodyNNValidator.blobs.find(current_blob_name) != bodyNNValidator.blobs.end()) {
                blobs[current_blob_name].insert(bodyNNValidator.blobs[current_blob_name].begin(),
                                                bodyNNValidator.blobs[current_blob_name].end());
            }
        }
    }

    return Result();
}